

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::Str::toUpper(string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *str_local;
  
  uVar1 = ::std::__cxx11::string::begin();
  uVar2 = ::std::__cxx11::string::end();
  uVar3 = ::std::__cxx11::string::begin();
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,el::base::utils::Str::toUpper(std::__cxx11::string&)::__0>
            (uVar1,uVar2,uVar3);
  return str;
}

Assistant:

std::string& Str::toUpper(std::string& str) {
  std::transform(str.begin(), str.end(), str.begin(),
  [](char c) {
    return static_cast<char>(::toupper(c));
  });
  return str;
}